

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

bool __thiscall
NNTreeIterator::deepen(NNTreeIterator *this,QPDFObjectHandle *node,bool first,bool allow_empty)

{
  QPDF *pQVar1;
  QPDFObjectHandle *oh;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int local_314;
  int local_310;
  int local_30c;
  int local_2f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  QPDFObjectHandle local_1f0;
  QPDFObjectHandle local_1e0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  QPDFObjectHandle next;
  int local_158;
  int kid_number;
  undefined1 local_150 [4];
  int nitems;
  QPDFObjectHandle items;
  int nkids;
  undefined1 local_118 [8];
  QPDFObjectHandle kids;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  QPDFObjGen local_b4;
  QPDFObjGen local_a0;
  reference local_98;
  PathElement *i;
  iterator __end1;
  iterator __begin1;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *__range1;
  set seen;
  undefined1 local_40 [7];
  bool failed;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> opath;
  bool allow_empty_local;
  bool first_local;
  QPDFObjectHandle *node_local;
  NNTreeIterator *this_local;
  
  opath.super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size._6_1_ = allow_empty;
  opath.super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size._7_1_ = first;
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  list((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)local_40,
       &this->path);
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count._7_1_ = 0;
  QPDFObjGen::set::set((set *)&__range1);
  __end1 = std::__cxx11::
           list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                     (&this->path);
  i = (PathElement *)
      std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
      ::end(&this->path);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&i), bVar2) {
    local_98 = std::_List_iterator<NNTreeIterator::PathElement>::operator*(&__end1);
    local_a0 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_98);
    QPDFObjGen::set::add((set *)&__range1,local_a0);
    std::_List_iterator<NNTreeIterator::PathElement>::operator++(&__end1);
  }
  do {
    if (((seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count._7_1_ ^ 0xff) & 1) == 0) break;
    local_b4 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&node->super_BaseHandle);
    bVar2 = QPDFObjGen::set::add((set *)&__range1,local_b4);
    if (!bVar2) {
      QTC::TC("qpdf","NNTree deepen: loop",0);
      pQVar1 = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"loop detected while traversing name/number tree",&local_d9);
      warn(pQVar1,node,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    }
    bVar2 = QPDFObjectHandle::isDictionary(node);
    if (!bVar2) {
      QTC::TC("qpdf","NNTree node is not a dictionary",0);
      pQVar1 = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"non-dictionary node while traversing name/number tree",
                 (allocator<char> *)
                 ((long)&kids.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      warn(pQVar1,node,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&kids.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nkids,"/Kids",
               (allocator<char> *)
               ((long)&items.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_118,(string *)node);
    std::__cxx11::string::~string((string *)&nkids);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&items.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_118);
    if (bVar2) {
      local_2f4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_118);
    }
    else {
      local_2f4 = 0;
    }
    items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = local_2f4;
    (*(code *)**(undefined8 **)this->impl->details)();
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)node);
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_150);
    if (bVar2) {
      local_30c = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_150);
    }
    else {
      local_30c = 0;
    }
    if (local_30c < 1) {
      if ((int)items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi < 1) {
        if (((opath.
              super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
              ._M_impl._M_node._M_size._6_1_ & 1) == 0) ||
           (bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_150), !bVar2)) {
          QTC::TC("qpdf","NNTree deepen: invalid node",0);
          pQVar1 = this->impl->qpdf;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (*(code *)**(undefined8 **)this->impl->details)();
          std::operator+(&local_290,"name/number tree node has neither non-empty ",__rhs);
          std::operator+(&local_270,&local_290," nor /Kids");
          warn(pQVar1,node,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
          local_158 = 5;
        }
        else {
          QTC::TC("qpdf","NNTree deepen found empty",0);
          setItemNumber(this,node,-1);
          local_158 = 5;
        }
      }
      else {
        if ((opath.
             super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
             ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
          local_314 = (int)items.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + -1;
        }
        else {
          local_314 = 0;
        }
        next.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = local_314;
        addPathElement(this,node,local_314);
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_170,(int)local_118);
        bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_170);
        if (!bVar2) {
          if ((this->impl->auto_repair & 1U) == 0) {
            QTC::TC("qpdf","NNTree warn indirect kid",0);
            pQVar1 = this->impl->qpdf;
            std::__cxx11::to_string
                      (&local_250,
                       next.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _4_4_);
            std::operator+(&local_230,"kid number ",&local_250);
            std::operator+(&local_210,&local_230," is not an indirect object");
            warn(pQVar1,node,&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_250);
          }
          else {
            QTC::TC("qpdf","NNTree fix indirect kid",0);
            pQVar1 = this->impl->qpdf;
            std::__cxx11::to_string
                      (&local_1d0,
                       next.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _4_4_);
            std::operator+(&local_1b0,"converting kid number ",&local_1d0);
            std::operator+(&local_190,&local_1b0," to an indirect object");
            warn(pQVar1,node,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1d0);
            oh = (QPDFObjectHandle *)this->impl->qpdf;
            QPDFObjectHandle::QPDFObjectHandle(&local_1f0,(QPDFObjectHandle *)local_170);
            QPDF::makeIndirectObject((QPDF *)&local_1e0,oh);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)local_170,&local_1e0);
            QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
            QPDFObjectHandle::~QPDFObjectHandle(&local_1f0);
            QPDFObjectHandle::setArrayItem
                      ((QPDFObjectHandle *)local_118,
                       next.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _4_4_,(QPDFObjectHandle *)local_170);
          }
        }
        QPDFObjectHandle::operator=(node,(QPDFObjectHandle *)local_170);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_170);
        local_158 = 0;
      }
    }
    else {
      if ((opath.
           super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
           ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
        local_310 = local_30c + -2;
      }
      else {
        local_310 = 0;
      }
      setItemNumber(this,node,local_310);
      local_158 = 5;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_150);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
  } while (local_158 == 0);
  bVar2 = (seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
           _M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0;
  if (!bVar2) {
    std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
    operator=(&this->path,
              (list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)
              local_40);
  }
  QPDFObjGen::set::~set((set *)&__range1);
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  ~list((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)local_40)
  ;
  return bVar2;
}

Assistant:

bool
NNTreeIterator::deepen(QPDFObjectHandle node, bool first, bool allow_empty)
{
    // Starting at this node, descend through the first or last kid until we reach a node with
    // items. If we succeed, return true; otherwise return false and leave path alone.

    auto opath = this->path;
    bool failed = false;

    QPDFObjGen::set seen;
    for (auto const& i: this->path) {
        seen.add(i.node);
    }
    while (!failed) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree deepen: loop");
            warn(impl.qpdf, node, "loop detected while traversing name/number tree");
            failed = true;
            break;
        }

        if (!node.isDictionary()) {
            QTC::TC("qpdf", "NNTree node is not a dictionary");
            warn(impl.qpdf, node, "non-dictionary node while traversing name/number tree");
            failed = true;
            break;
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            setItemNumber(node, first ? 0 : nitems - 2);
            break;
        } else if (nkids > 0) {
            int kid_number = first ? 0 : nkids - 1;
            addPathElement(node, kid_number);
            auto next = kids.getArrayItem(kid_number);
            if (!next.isIndirect()) {
                if (impl.auto_repair) {
                    QTC::TC("qpdf", "NNTree fix indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("converting kid number " + std::to_string(kid_number) +
                         " to an indirect object"));
                    next = impl.qpdf.makeIndirectObject(next);
                    kids.setArrayItem(kid_number, next);
                } else {
                    QTC::TC("qpdf", "NNTree warn indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("kid number " + std::to_string(kid_number) +
                         " is not an indirect object"));
                }
            }
            node = next;
        } else if (allow_empty && items.isArray()) {
            QTC::TC("qpdf", "NNTree deepen found empty");
            setItemNumber(node, -1);
            break;
        } else {
            QTC::TC("qpdf", "NNTree deepen: invalid node");
            warn(
                impl.qpdf,
                node,
                ("name/number tree node has neither non-empty " + impl.details.itemsKey() +
                 " nor /Kids"));
            failed = true;
            break;
        }
    }
    if (failed) {
        this->path = opath;
        return false;
    }
    return true;
}